

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

pair<llvm::DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_false>,_bool>
* __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,llvm::detail::DenseSetEmpty,llvm::DWARFDebugNames::AbbrevMapInfo,llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>,llvm::DWARFDebugNames::Abbrev,llvm::detail::DenseSetEmpty,llvm::DWARFDebugNames::AbbrevMapInfo,llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>
::try_emplace<llvm::detail::DenseSetEmpty&>
          (pair<llvm::DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_false>,_bool>
           *__return_storage_ptr__,
          DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,llvm::detail::DenseSetEmpty,llvm::DWARFDebugNames::AbbrevMapInfo,llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>,llvm::DWARFDebugNames::Abbrev,llvm::detail::DenseSetEmpty,llvm::DWARFDebugNames::AbbrevMapInfo,llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>
          *this,Abbrev *Key,DenseSetEmpty *Args)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *in_RAX;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *local_38;
  
  local_38 = in_RAX;
  bVar3 = DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
          ::LookupBucketFor<llvm::DWARFDebugNames::Abbrev>
                    ((DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                      *)this,Key,&local_38);
  if (!bVar3) {
    local_38 = InsertIntoBucket<llvm::DWARFDebugNames::Abbrev,llvm::detail::DenseSetEmpty&>
                         (this,local_38,Key,Args);
  }
  uVar1 = *(uint *)(this + 0x10);
  lVar2 = *(long *)this;
  (__return_storage_ptr__->first).Ptr = local_38;
  (__return_storage_ptr__->first).End = (pointer)((ulong)uVar1 * 0x20 + lVar2);
  __return_storage_ptr__->second = !bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(KeyT &&Key, Ts &&... Args) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return std::make_pair(
               makeIterator(TheBucket, getBucketsEnd(), *this, true),
               false); // Already in map.

    // Otherwise, insert the new element.
    TheBucket =
        InsertIntoBucket(TheBucket, std::move(Key), std::forward<Ts>(Args)...);
    return std::make_pair(
             makeIterator(TheBucket, getBucketsEnd(), *this, true),
             true);
  }